

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

int __thiscall f8n::db::Connection::Execute(Connection *this,char *sql)

{
  int iVar1;
  sqlite3_stmt *stmt;
  unique_lock<std::mutex> lock;
  sqlite3_stmt *local_38;
  unique_lock<std::mutex> local_30;
  
  local_38 = (sqlite3_stmt *)0x0;
  local_30._M_device = &this->mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar1 = sqlite3_prepare_v2(this->connection,sql,-1,&local_38,(char **)0x0);
  if (iVar1 == 0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    iVar1 = sqlite3_step(local_38);
    if ((iVar1 == 0) || (iVar1 == 0x65)) {
      sqlite3_reset(local_38);
      sqlite3_finalize(local_38);
      return 0;
    }
    sqlite3_finalize(local_38);
  }
  else {
    sqlite3_finalize(local_38);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  return 1;
}

Assistant:

int Connection::Execute(const char* sql) {
    sqlite3_stmt *stmt  = nullptr;

    /* prepare seems to give errors when interrupted */
    {
        std::unique_lock<std::mutex> lock(this->mutex);

        if (sqlite3_prepare_v2(this->connection, sql, -1, &stmt, nullptr) != SQLITE_OK) {
            sqlite3_finalize(stmt);
            return Error;
        }
    }

    int error = this->StepStatement(stmt);
    if (error != SQLITE_OK && error != SQLITE_DONE) {
        sqlite3_finalize(stmt);
        return Error;
    }

    sqlite3_reset(stmt);
    sqlite3_finalize(stmt);

    return Okay;
}